

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

ptls_t * new_instance(ptls_context_t *ctx,int is_server)

{
  byte bVar1;
  size_t sVar2;
  st_ptls_update_open_count_t *psVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ptls_t *ppVar8;
  byte bVar9;
  long in_FS_OFFSET;
  uint32_t r;
  uint local_38;
  uint uStack_34;
  
  if (ctx->get_time == (ptls_get_time_t *)0x0) {
    __assert_fail("ctx->get_time != NULL && \"please set ctx->get_time to `&ptls_get_time`; see #92\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x140e,"ptls_t *new_instance(ptls_context_t *, int)");
  }
  sVar2 = (ctx->pre_shared_key).identity.len;
  if ((ctx->pre_shared_key).identity.base == (uint8_t *)0x0) {
    if ((((sVar2 != 0) || ((ctx->pre_shared_key).secret.base != (uint8_t *)0x0)) ||
        ((ctx->pre_shared_key).secret.len != 0)) ||
       ((ctx->pre_shared_key).hash != (ptls_hash_algorithm_t *)0x0)) {
      __assert_fail("ctx->pre_shared_key.identity.len == 0 && ctx->pre_shared_key.secret.base == NULL && ctx->pre_shared_key.secret.len == 0 && ctx->pre_shared_key.hash == NULL && \"`ptls_context_t::pre_shared_key` in inconsitent state\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x1416,"ptls_t *new_instance(ptls_context_t *, int)");
    }
  }
  else if (((sVar2 == 0) || ((ctx->pre_shared_key).secret.base == (uint8_t *)0x0)) ||
          (((ctx->pre_shared_key).secret.len == 0 ||
           ((ctx->pre_shared_key).hash == (ptls_hash_algorithm_t *)0x0)))) {
    __assert_fail("ctx->pre_shared_key.identity.len != 0 && ctx->pre_shared_key.secret.base != NULL && ctx->pre_shared_key.secret.len != 0 && ctx->pre_shared_key.hash != NULL && \"`ptls_context_t::pre_shared_key` in incosistent state\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x1412,"ptls_t *new_instance(ptls_context_t *, int)");
  }
  ppVar8 = (ptls_t *)malloc(0x2b8);
  if (ppVar8 == (ptls_t *)0x0) {
    ppVar8 = (ptls_t *)0x0;
  }
  else {
    psVar3 = ctx->update_open_count;
    if (psVar3 != (st_ptls_update_open_count_t *)0x0) {
      (*psVar3->cb)(psVar3,1);
    }
    memset(&ppVar8->state,0,0x2b0);
    ppVar8->ctx = ctx;
    bVar1 = ppVar8->field_0x1e8;
    bVar9 = (byte)is_server & 1;
    ppVar8->field_0x1e8 = bVar1 & 0xfe | bVar9;
    ppVar8->field_0x1e8 = bVar1 & 0xfa | bVar9 | ctx->field_0xb8 & 4;
    puVar4 = *(undefined8 **)(in_FS_OFFSET + -0x148);
    if (puVar4 == (undefined8 *)0x0) {
      (*ctx->random_bytes)(&local_38,4);
      (ppVar8->log_state).random_ = (float)local_38 * 2.3283064e-10;
      uVar5 = _vsnprintf;
      *(undefined8 *)&(ppVar8->log_state).address.__in6_u = _in6addr_any;
      *(undefined8 *)((long)&(ppVar8->log_state).address.__in6_u + 8) = uVar5;
      *(ulong *)&(ppVar8->log_state).field_0x14 = (ulong)uStack_34;
      *(undefined8 *)&(ppVar8->log_state).state.field_0x4 = 0;
      *(undefined4 *)((long)&(ppVar8->log_state).state.generation + 4) = 0;
    }
    else {
      (ppVar8->log_state).state.generation = puVar4[4];
      uVar5 = *puVar4;
      uVar6 = puVar4[1];
      uVar7 = puVar4[3];
      *(undefined8 *)((long)&(ppVar8->log_state).address.__in6_u + 0xc) = puVar4[2];
      *(undefined8 *)&(ppVar8->log_state).state = uVar7;
      *(undefined8 *)&ppVar8->log_state = uVar5;
      *(undefined8 *)((long)&(ppVar8->log_state).address.__in6_u + 4) = uVar6;
    }
  }
  return ppVar8;
}

Assistant:

static ptls_t *new_instance(ptls_context_t *ctx, int is_server)
{
    ptls_t *tls;

    /* check consistency of `ptls_context_t` before instantiating a connection object */
    assert(ctx->get_time != NULL && "please set ctx->get_time to `&ptls_get_time`; see #92");
    if (ctx->pre_shared_key.identity.base != NULL) {
        assert(ctx->pre_shared_key.identity.len != 0 && ctx->pre_shared_key.secret.base != NULL &&
               ctx->pre_shared_key.secret.len != 0 && ctx->pre_shared_key.hash != NULL &&
               "`ptls_context_t::pre_shared_key` in incosistent state");
    } else {
        assert(ctx->pre_shared_key.identity.len == 0 && ctx->pre_shared_key.secret.base == NULL &&
               ctx->pre_shared_key.secret.len == 0 && ctx->pre_shared_key.hash == NULL &&
               "`ptls_context_t::pre_shared_key` in inconsitent state");
    }

    if ((tls = malloc(sizeof(*tls))) == NULL)
        return NULL;

    update_open_count(ctx, 1);
    *tls = (ptls_t){ctx};
    tls->is_server = is_server;
    tls->send_change_cipher_spec = ctx->send_change_cipher_spec;

#if PTLS_HAVE_LOG
    if (ptls_log_conn_state_override != NULL) {
        tls->log_state = *ptls_log_conn_state_override;
    } else {
        ptls_log_init_conn_state(&tls->log_state, ctx->random_bytes);
    }
#endif

    return tls;
}